

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

int bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  Hix hix;
  mapped_type *this;
  Register in_register_00000014;
  undefined4 in_register_0000003c;
  Addr local_78;
  Addr local_68;
  undefined1 local_58 [52];
  key_type local_24;
  
  local_78.r_.r = in_register_00000014.r;
  local_78.tag_ = __len;
  hix = Addr::hix(&local_68);
  Hcell::ref((Hcell *)local_58,hix);
  local_24.hix = (int)Addr::hix(&local_78);
  this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
         operator[]((map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                     *)__addr,&local_24);
  Hcell::operator=(this,(Hcell *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  Machine::Machine((Machine *)CONCAT44(in_register_0000003c,__fd),(Machine *)__addr);
  return __fd;
}

Assistant:

Machine bind(Machine m, Addr storeLoc, Addr toStore) {
    m.heap[storeLoc.hix()] = Hcell::ref(toStore.hix());
    return m;
}